

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

int64_t __thiscall CBlockIndex::GetMedianTimePast(CBlockIndex *this)

{
  undefined1 auVar1 [16];
  int i;
  uint uVar2;
  undefined1 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  int64_t pmedian [11];
  undefined1 local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  puVar3 = local_20;
  uVar2 = 0;
  for (; (uVar2 < 0xb && (this != (CBlockIndex *)0x0)); this = this->pprev) {
    *(ulong *)(puVar3 + -8) = (ulong)this->nTime;
    puVar3 = puVar3 + -8;
    uVar2 = uVar2 + 1;
    lVar4 = lVar4 + 8;
  }
  std::__sort<long*,__gnu_cxx::__ops::_Iter_less_iter>(puVar3);
  auVar1._8_8_ = lVar4 >> 0x3f;
  auVar1._0_8_ = lVar4 >> 3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return *(int64_t *)(puVar3 + SUB168(auVar1 / SEXT816(2),0) * 8);
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetMedianTimePast() const
    {
        int64_t pmedian[nMedianTimeSpan];
        int64_t* pbegin = &pmedian[nMedianTimeSpan];
        int64_t* pend = &pmedian[nMedianTimeSpan];

        const CBlockIndex* pindex = this;
        for (int i = 0; i < nMedianTimeSpan && pindex; i++, pindex = pindex->pprev)
            *(--pbegin) = pindex->GetBlockTime();

        std::sort(pbegin, pend);
        return pbegin[(pend - pbegin) / 2];
    }